

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteU32Leb128WithReloc
          (BinaryWriter *this,Index index,char *desc,RelocType reloc_type)

{
  Index IVar1;
  uint uVar2;
  pointer __first;
  pointer __src;
  char *pcVar3;
  ulong uVar4;
  pointer __result;
  pointer pRVar5;
  pointer pRVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  pointer pSVar10;
  _Tp_alloc_type *__alloc;
  mapped_type mVar11;
  size_t __n;
  ulong uVar12;
  RelocType local_5c;
  size_t offset;
  key_type local_50;
  
  if (this->options_->relocatable != true) {
    WriteU32Leb128(this->stream_,index,desc);
    return;
  }
  local_5c = reloc_type;
  if ((this->current_reloc_section_ == (RelocSection *)0x0) ||
     (this->current_reloc_section_->section_index != this->section_count_)) {
    pcVar3 = GetSectionName(this->last_section_type_);
    pRVar6 = (this->reloc_sections_).
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar6 == (this->reloc_sections_).
                  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __first = (this->reloc_sections_).
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pRVar6 - (long)__first == 0x7ffffffffffffff8) goto LAB_00139f4e;
      uVar9 = ((long)pRVar6 - (long)__first) / 0x28;
      uVar4 = uVar9;
      if (pRVar6 == __first) {
        uVar4 = 1;
      }
      uVar12 = uVar4 + uVar9;
      if (0x333333333333332 < uVar12) {
        uVar12 = 0x333333333333333;
      }
      if (CARRY8(uVar4,uVar9)) {
        uVar12 = 0x333333333333333;
      }
      if (uVar12 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar12 * 0x28);
      }
      uVar2 = this->section_count_;
      __alloc = (_Tp_alloc_type *)(ulong)uVar2;
      __result[uVar9].name = pcVar3;
      __result[uVar9].section_index = uVar2;
      __result[uVar9].relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      __result[uVar9].relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __result[uVar9].relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar5 = std::
               vector<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ::_S_relocate(__first,pRVar6,__result,__alloc);
      pRVar6 = std::
               vector<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ::_S_relocate(pRVar6,pRVar6,pRVar5 + 1,__alloc);
      if (__first != (pointer)0x0) {
        operator_delete(__first);
      }
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar6;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar12;
    }
    else {
      IVar1 = this->section_count_;
      pRVar6->name = pcVar3;
      pRVar6->section_index = IVar1;
      (pRVar6->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pRVar6->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pRVar6->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pRVar6 = (this->reloc_sections_).
               super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar6;
    }
    this->current_reloc_section_ = pRVar6 + -1;
  }
  offset = this->stream_->offset_ - this->last_section_payload_offset_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (reloc_type != First) {
    if (reloc_type != GlobalIndexLEB) {
      if ((int)reloc_type < 0xd) {
        pcVar3 = *(char **)(g_reloc_type_name + (long)(int)reloc_type * 8);
      }
      else {
        pcVar3 = "<error_reloc_type>";
      }
      fprintf(_stderr,"warning: unsupported relocation type: %s\n",pcVar3);
      mVar11 = 0xffffffff;
      goto LAB_00139ec4;
    }
    reloc_type = Global;
  }
  std::__cxx11::string::_M_assign((string *)&local_50);
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->symtab_)._M_h,&local_50);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    mVar11 = (mapped_type)
             (((long)(this->symbols_).
                     super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->symbols_).
                    super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->symtab_,&local_50);
    *pmVar8 = mVar11;
    pSVar10 = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar10 ==
        (this->symbols_).
        super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __src = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)pSVar10 - (long)__src;
      if (__n == 0x7ffffffffffffff8) {
LAB_00139f4e:
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar9 = (long)__n / 0xc;
      uVar4 = 1;
      if (pSVar10 != __src) {
        uVar4 = uVar9;
      }
      uVar12 = uVar4 + uVar9;
      if (0xaaaaaaaaaaaaaa9 < uVar12) {
        uVar12 = 0xaaaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar4,uVar9)) {
        uVar12 = 0xaaaaaaaaaaaaaaa;
      }
      if (uVar12 == 0) {
        pSVar10 = (pointer)0x0;
      }
      else {
        pSVar10 = (pointer)operator_new(uVar12 * 0xc);
      }
      pSVar10[uVar9].symbol_index = mVar11;
      pSVar10[uVar9].type = reloc_type;
      pSVar10[uVar9].element_index = index;
      if (0 < (long)__n) {
        memmove(pSVar10,__src,__n);
      }
      if (__src != (pointer)0x0) {
        operator_delete(__src);
      }
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar10;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pSVar10 + __n + 0xc);
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar10 + uVar12;
    }
    else {
      pSVar10->symbol_index = mVar11;
      pSVar10->type = reloc_type;
      pSVar10->element_index = index;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar10 + 1;
    }
  }
  else {
    mVar11 = *(mapped_type *)
              ((long)iVar7.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                     ._M_cur + 0x28);
  }
LAB_00139ec4:
  std::__cxx11::string::_M_dispose();
  local_50._M_dataplus._M_p._0_4_ = mVar11;
  std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
  emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
            ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
             &this->current_reloc_section_->relocations,&local_5c,&offset,(uint *)&local_50);
  WriteFixedU32Leb128(this->stream_,index,desc);
  return;
}

Assistant:

void BinaryWriter::WriteU32Leb128WithReloc(Index index,
                                           const char* desc,
                                           RelocType reloc_type) {
  if (options_.relocatable) {
    AddReloc(reloc_type, index);
    WriteFixedU32Leb128(stream_, index, desc);
  } else {
    WriteU32Leb128(stream_, index, desc);
  }
}